

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ether_common.c
# Opt level: O3

LispPTR check_sum(LispPTR *args)

{
  uint uVar1;
  uint uVar2;
  DLword *pDVar3;
  uint uVar4;
  
  uVar4 = (uint)(ushort)args[2];
  if (0xe0000 < (int)args[1]) {
    uVar2 = args[1] + 1;
    pDVar3 = Lisp_world + *args;
    do {
      uVar4 = *(ushort *)((ulong)pDVar3 ^ 2) + uVar4;
      uVar1 = (uVar4 & 0xffff) + 1;
      if (uVar4 < 0x10000) {
        uVar1 = uVar4;
      }
      uVar4 = uVar1 * 2 + 1 & 0xffff;
      if (uVar1 < 0x8000) {
        uVar4 = uVar1 * 2;
      }
      uVar2 = uVar2 - 1;
      pDVar3 = pDVar3 + 1;
    } while (0xe0001 < uVar2);
  }
  uVar2 = uVar4 | 0xe0000;
  if (uVar4 == 0xffff) {
    uVar2 = 0xe0000;
  }
  return uVar2;
}

Assistant:

LispPTR check_sum(LispPTR *args)
{
  LispPTR checksum;
  DLword *address;
  int nwords;

  address = (DLword *)NativeAligned2FromLAddr(*args++);
  nwords = *args++;

  if (*args != NIL)
    checksum = (*args) & MASKWORD1;
  else
    checksum = 0;

  for (; nwords > (S_POSITIVE); address++, nwords--) {
    checksum = checksum + GETWORD(address);
    if (checksum > 0xffff) checksum = (checksum & 0xffff) + 1; /* add carry */

    if (checksum > 0x7fff) /* ROTATE LEFT 1 */
      checksum = ((checksum & 0x7fff) << 1) | 1;
    else
      checksum = checksum << 1;
  }

  if (checksum == MASKWORD1)
    return (S_POSITIVE); /* ret 0 */
  else
    return (S_POSITIVE | checksum);

}